

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O1

TermList __thiscall
Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>::denormalize
          (MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *this)

{
  TermList TVar1;
  ulong uVar2;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *r;
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> local_b0;
  uint local_90 [4];
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> local_80;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> local_60;
  PolyNf local_40;
  AnyPoly local_28;
  
  ::Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::Stack
            (&local_80,&this->_factors);
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Monom
            (&local_60,(MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)&local_80);
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Polynom(&local_b0,&local_60);
  ::Lib::
  perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>
            ((Lib *)local_90,&local_b0);
  local_28.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[7] = '\0';
  local_28.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._0_8_ = (ulong)local_90[0] << 8;
  local_28.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content._8_7_ = SUB87(local_90._8_8_,0);
  local_28.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[0xf] = SUB81(local_90._8_8_,7);
  local_28.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._17_3_ = 0;
  PolyNf::PolyNf(&local_40,&local_28);
  TVar1 = PolyNf::denormalize(&local_40);
  r = local_b0._summands._cursor;
  while (r != local_b0._summands._stack) {
    r = r + -1;
    mpz_clear((__mpz_struct *)r);
  }
  if (local_b0._summands._stack != (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0) {
    uVar2 = local_b0._summands._capacity << 5;
    if (uVar2 == 0) {
      ((local_b0._summands._stack)->numeral)._val[0]._mp_alloc =
           ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
      ((local_b0._summands._stack)->numeral)._val[0]._mp_size =
           ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_b0._summands._stack;
    }
    else if (uVar2 < 0x21) {
      ((local_b0._summands._stack)->numeral)._val[0]._mp_alloc =
           ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
      ((local_b0._summands._stack)->numeral)._val[0]._mp_size =
           ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_b0._summands._stack;
    }
    else if (uVar2 < 0x31) {
      ((local_b0._summands._stack)->numeral)._val[0]._mp_alloc =
           ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
      ((local_b0._summands._stack)->numeral)._val[0]._mp_size =
           ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_b0._summands._stack;
    }
    else if (uVar2 < 0x41) {
      ((local_b0._summands._stack)->numeral)._val[0]._mp_alloc =
           ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
      ((local_b0._summands._stack)->numeral)._val[0]._mp_size =
           ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_b0._summands._stack;
    }
    else {
      operator_delete(local_b0._summands._stack,0x10);
    }
  }
  mpz_clear((__mpz_struct *)&local_60);
  if (local_80._stack != (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0) {
    uVar2 = local_80._capacity * 0x1c + 0xf & 0xfffffffffffffff0;
    if (uVar2 == 0) {
      *(undefined8 *)
       &((local_80._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_80._stack;
    }
    else if (uVar2 < 0x11) {
      *(undefined8 *)
       &((local_80._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_80._stack;
    }
    else if (uVar2 < 0x19) {
      *(undefined8 *)
       &((local_80._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_80._stack;
    }
    else if (uVar2 < 0x21) {
      *(undefined8 *)
       &((local_80._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_80._stack;
    }
    else if (uVar2 < 0x31) {
      *(undefined8 *)
       &((local_80._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_80._stack;
    }
    else if (uVar2 < 0x41) {
      *(undefined8 *)
       &((local_80._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_80._stack;
    }
    else {
      operator_delete(local_80._stack,0x10);
    }
  }
  return (TermList)TVar1._content;
}

Assistant:

TermList MonomFactors<Number>::denormalize()  const
{
  return PolyNf(AnyPoly(perfect(Polynom(Monom(MonomFactors(*this)))))).denormalize(); 
}